

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Version::Version
          (Version *this,uint _majorVersion,uint _minorVersion,uint _patchNumber,string *_branchName
          ,uint _buildNumber)

{
  uint _buildNumber_local;
  string *_branchName_local;
  uint _patchNumber_local;
  uint _minorVersion_local;
  uint _majorVersion_local;
  Version *this_local;
  
  this->majorVersion = _majorVersion;
  this->minorVersion = _minorVersion;
  this->patchNumber = _patchNumber;
  std::__cxx11::string::string((string *)&this->branchName,(string *)_branchName);
  this->buildNumber = _buildNumber;
  return;
}

Assistant:

Version::Version
        (   unsigned int _majorVersion,
            unsigned int _minorVersion,
            unsigned int _patchNumber,
            std::string const& _branchName,
            unsigned int _buildNumber )
    :   majorVersion( _majorVersion ),
        minorVersion( _minorVersion ),
        patchNumber( _patchNumber ),
        branchName( _branchName ),
        buildNumber( _buildNumber )
    {}